

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O3

Aig_Man_t * Fra_BmcFrames(Fra_Bmc_t *p,int fKeepPos)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  Aig_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Aig_Obj_t *pAVar10;
  void *pvVar11;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  ulong uVar14;
  Aig_Obj_t *pAVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  Aig_Man_t *pAVar19;
  
  p_00 = Aig_ManStart(p->nFramesAll * p->pAig->vObjs->nSize);
  pAVar19 = p->pAig;
  pcVar2 = pAVar19->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = pAVar19->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  iVar18 = p->nFramesAll;
  if (0 < iVar18) {
    pAVar10 = p_00->pConst1;
    lVar13 = 0;
    do {
      pAVar15 = p->pAig->pConst1;
      lVar3 = *(long *)((long)(pAVar15->field_5).pData + 0x40);
      *(Aig_Obj_t **)
       (*(long *)(lVar3 + 0x30) + ((long)*(int *)(lVar3 + 8) * (long)pAVar15->Id + lVar13) * 8) =
           pAVar10;
      lVar13 = lVar13 + 1;
    } while (iVar18 != (int)lVar13);
    pAVar19 = p->pAig;
    if (0 < iVar18) {
      iVar16 = 0;
      do {
        if (pAVar19->nRegs < pAVar19->nObjs[2]) {
          lVar13 = 0;
          do {
            if (pAVar19->vCis->nSize <= lVar13) goto LAB_005c708e;
            pvVar11 = pAVar19->vCis->pArray[lVar13];
            pAVar10 = Aig_ObjCreateCi(p_00);
            lVar3 = *(long *)(*(long *)((long)pvVar11 + 0x28) + 0x40);
            *(Aig_Obj_t **)
             (*(long *)(lVar3 + 0x30) +
             (long)(*(int *)(lVar3 + 8) * *(int *)((long)pvVar11 + 0x24) + iVar16) * 8) = pAVar10;
            lVar13 = lVar13 + 1;
            pAVar19 = p->pAig;
          } while (lVar13 < (long)pAVar19->nObjs[2] - (long)pAVar19->nRegs);
          iVar18 = p->nFramesAll;
        }
        iVar16 = iVar16 + 1;
      } while (iVar16 < iVar18);
    }
  }
  iVar16 = pAVar19->nRegs;
  uVar7 = pAVar19->nObjs[2] - iVar16;
  pVVar12 = pAVar19->vCis;
  if ((int)uVar7 < pVVar12->nSize) {
    uVar14 = (ulong)uVar7;
    do {
      if ((int)uVar7 < 0) {
LAB_005c708e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar13 = *(long *)(*(long *)((long)pVVar12->pArray[uVar14] + 0x28) + 0x40);
      *(ulong *)(*(long *)(lVar13 + 0x30) +
                (long)*(int *)(lVar13 + 8) * (long)*(int *)((long)pVVar12->pArray[uVar14] + 0x24) *
                8) = (ulong)p_00->pConst1 ^ 1;
      uVar14 = uVar14 + 1;
      pAVar19 = p->pAig;
      pVVar12 = pAVar19->vCis;
    } while ((int)uVar14 < pVVar12->nSize);
    iVar16 = pAVar19->nRegs;
  }
  pvVar11 = malloc((long)iVar16 << 3);
  if (0 < iVar18) {
    iVar16 = 0;
    while( true ) {
      pVVar12 = pAVar19->vObjs;
      if (0 < pVVar12->nSize) {
        lVar13 = 0;
        do {
          pvVar4 = pVVar12->pArray[lVar13];
          if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
            if (((ulong)pvVar4 & 1) != 0) goto LAB_005c70ad;
            uVar14 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
            if (uVar14 == 0) {
              pAVar10 = (Aig_Obj_t *)0x0;
            }
            else {
              lVar3 = *(long *)(*(long *)(uVar14 + 0x28) + 0x40);
              pAVar10 = (Aig_Obj_t *)
                        ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^
                        *(ulong *)(*(long *)(lVar3 + 0x30) +
                                  (long)(*(int *)(lVar3 + 8) * *(int *)(uVar14 + 0x24) + iVar16) * 8
                                  ));
            }
            uVar14 = *(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe;
            if (uVar14 == 0) {
              pAVar15 = (Aig_Obj_t *)0x0;
            }
            else {
              lVar3 = *(long *)(*(long *)(uVar14 + 0x28) + 0x40);
              pAVar15 = (Aig_Obj_t *)
                        ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^
                        *(ulong *)(*(long *)(lVar3 + 0x30) +
                                  (long)(*(int *)(lVar3 + 8) * *(int *)(uVar14 + 0x24) + iVar16) * 8
                                  ));
            }
            pAVar10 = Aig_And(p_00,pAVar10,pAVar15);
            lVar3 = *(long *)(*(long *)((long)pvVar4 + 0x28) + 0x40);
            *(Aig_Obj_t **)
             (*(long *)(lVar3 + 0x30) +
             (long)(*(int *)(lVar3 + 8) * *(int *)((long)pvVar4 + 0x24) + iVar16) * 8) = pAVar10;
            pAVar19 = p->pAig;
          }
          lVar13 = lVar13 + 1;
          pVVar12 = pAVar19->vObjs;
        } while (lVar13 < pVVar12->nSize);
        iVar18 = p->nFramesAll;
      }
      if (iVar16 == iVar18 + -1) break;
      iVar1 = pAVar19->nRegs;
      uVar7 = pAVar19->nObjs[3] - iVar1;
      pVVar12 = pAVar19->vCos;
      lVar13 = 0;
      if ((int)uVar7 < pVVar12->nSize) {
        lVar13 = 0;
        do {
          if ((int)uVar7 < 0) goto LAB_005c708e;
          if (((ulong)pVVar12->pArray[(ulong)uVar7 + lVar13] & 1) != 0) goto LAB_005c70ad;
          uVar14 = *(ulong *)((long)pVVar12->pArray[(ulong)uVar7 + lVar13] + 8);
          uVar17 = uVar14 & 0xfffffffffffffffe;
          if (uVar17 == 0) {
            uVar14 = 0;
          }
          else {
            lVar3 = *(long *)(*(long *)(uVar17 + 0x28) + 0x40);
            uVar14 = (ulong)((uint)uVar14 & 1) ^
                     *(ulong *)(*(long *)(lVar3 + 0x30) +
                               (long)(*(int *)(lVar3 + 8) * *(int *)(uVar17 + 0x24) + iVar16) * 8);
          }
          *(ulong *)((long)pvVar11 + lVar13 * 8) = uVar14;
          lVar13 = lVar13 + 1;
          pVVar12 = pAVar19->vCos;
        } while ((int)((int)lVar13 + uVar7) < pVVar12->nSize);
      }
      if ((int)lVar13 != iVar1) {
        __assert_fail("k == Aig_ManRegNum(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraBmc.c"
                      ,0x112,"Aig_Man_t *Fra_BmcFrames(Fra_Bmc_t *, int)");
      }
      uVar7 = pAVar19->nObjs[2] - iVar1;
      pVVar12 = pAVar19->vCis;
      lVar13 = 0;
      if ((int)uVar7 < pVVar12->nSize) {
        lVar13 = 0;
        do {
          if ((int)uVar7 < 0) goto LAB_005c708e;
          lVar6 = (ulong)uVar7 + lVar13;
          lVar3 = lVar13 * 8;
          lVar13 = lVar13 + 1;
          lVar5 = *(long *)(*(long *)((long)pVVar12->pArray[lVar6] + 0x28) + 0x40);
          *(undefined8 *)
           (*(long *)(lVar5 + 0x30) +
           (long)(*(int *)(lVar5 + 8) * *(int *)((long)pVVar12->pArray[lVar6] + 0x24) + iVar16 + 1)
           * 8) = *(undefined8 *)((long)pvVar11 + lVar3);
          pAVar19 = p->pAig;
          pVVar12 = pAVar19->vCis;
        } while ((int)((int)lVar13 + uVar7) < pVVar12->nSize);
      }
      if ((int)lVar13 != pAVar19->nRegs) {
        __assert_fail("k == Aig_ManRegNum(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraBmc.c"
                      ,0x117,"Aig_Man_t *Fra_BmcFrames(Fra_Bmc_t *, int)");
      }
      iVar16 = iVar16 + 1;
      if (iVar18 <= iVar16) break;
    }
  }
  if (pvVar11 != (void *)0x0) {
    free(pvVar11);
  }
  if (fKeepPos == 0) {
    pVVar12 = p_00->vObjs;
    if (0 < pVVar12->nSize) {
      lVar13 = 0;
      do {
        pAVar10 = (Aig_Obj_t *)pVVar12->pArray[lVar13];
        if (((pAVar10 != (Aig_Obj_t *)0x0) && ((*(ulong *)&pAVar10->field_0x18 & 0xffffffc0) == 0))
           && (((uint)*(ulong *)&pAVar10->field_0x18 & 7) - 5 < 2)) {
          Aig_ObjCreateCo(p_00,pAVar10);
          pVVar12 = p_00->vObjs;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar12->nSize);
    }
  }
  else {
    if (0 < iVar18) {
      iVar16 = 0;
      do {
        if (pAVar19->nRegs < pAVar19->nObjs[3]) {
          lVar13 = 0;
          do {
            if (pAVar19->vCos->nSize <= lVar13) goto LAB_005c708e;
            pvVar11 = pAVar19->vCos->pArray[lVar13];
            if (((ulong)pvVar11 & 1) != 0) {
LAB_005c70ad:
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraBmc.c"
                            ,0x36,"Aig_Obj_t *Bmc_ObjChild0Frames(Aig_Obj_t *, int)");
            }
            uVar14 = *(ulong *)((long)pvVar11 + 8);
            uVar17 = uVar14 & 0xfffffffffffffffe;
            if (uVar17 == 0) {
              pAVar10 = (Aig_Obj_t *)0x0;
            }
            else {
              lVar3 = *(long *)(*(long *)(uVar17 + 0x28) + 0x40);
              pAVar10 = (Aig_Obj_t *)
                        ((ulong)((uint)uVar14 & 1) ^
                        *(ulong *)(*(long *)(lVar3 + 0x30) +
                                  (long)(*(int *)(lVar3 + 8) * *(int *)(uVar17 + 0x24) + iVar16) * 8
                                  ));
            }
            Aig_ObjCreateCo(p_00,pAVar10);
            lVar13 = lVar13 + 1;
            pAVar19 = p->pAig;
          } while (lVar13 < (long)pAVar19->nObjs[3] - (long)pAVar19->nRegs);
          iVar18 = p->nFramesAll;
        }
        iVar16 = iVar16 + 1;
      } while (iVar16 < iVar18);
    }
    Aig_ManCleanup(p_00);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Fra_BmcFrames( Fra_Bmc_t * p, int fKeepPos )
{
    Aig_Man_t * pAigFrames;
    Aig_Obj_t * pObj, * pObjNew;
    Aig_Obj_t ** pLatches;
    int i, k, f;

    // start the fraig package
    pAigFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFramesAll );
    pAigFrames->pName = Abc_UtilStrsav( p->pAig->pName );
    pAigFrames->pSpec = Abc_UtilStrsav( p->pAig->pSpec );
    // create PI nodes for the frames
    for ( f = 0; f < p->nFramesAll; f++ )
        Bmc_ObjSetFrames( Aig_ManConst1(p->pAig), f, Aig_ManConst1(pAigFrames) );
    for ( f = 0; f < p->nFramesAll; f++ )
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Bmc_ObjSetFrames( pObj, f, Aig_ObjCreateCi(pAigFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( p->pAig, pObj, i )
        Bmc_ObjSetFrames( pObj, 0, Aig_ManConst0(pAigFrames) );

    // add timeframes
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p->pAig) );
    for ( f = 0; f < p->nFramesAll; f++ )
    {
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pAigFrames, Bmc_ObjChild0Frames(pObj,f), Bmc_ObjChild1Frames(pObj,f) );
            Bmc_ObjSetFrames( pObj, f, pObjNew );
        }
        if ( f == p->nFramesAll - 1 )
            break;
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            pLatches[k++] = Bmc_ObjChild0Frames(pObj,f);
        assert( k == Aig_ManRegNum(p->pAig) );
        // insert them to the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Bmc_ObjSetFrames( pObj, f+1, pLatches[k++] );
        assert( k == Aig_ManRegNum(p->pAig) );
    }
    ABC_FREE( pLatches );
    if ( fKeepPos )
    {
        for ( f = 0; f < p->nFramesAll; f++ )
            Aig_ManForEachPoSeq( p->pAig, pObj, i )
                Aig_ObjCreateCo( pAigFrames, Bmc_ObjChild0Frames(pObj,f) );
        Aig_ManCleanup( pAigFrames );
    }
    else
    {
        // add POs to all the dangling nodes
        Aig_ManForEachObj( pAigFrames, pObjNew, i )
            if ( Aig_ObjIsNode(pObjNew) && pObjNew->nRefs == 0 )
                Aig_ObjCreateCo( pAigFrames, pObjNew );
    }
    // return the new manager
    return pAigFrames;
}